

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

void __thiscall google::anon_unknown_1::FlagValue::~FlagValue(FlagValue *this)

{
  undefined8 *puVar1;
  
  if (this->owns_value_ != true) {
switchD_00193823_default:
    return;
  }
  switch(this->type_) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
    puVar1 = (undefined8 *)this->value_buffer_;
    break;
  case '\x06':
    puVar1 = (undefined8 *)this->value_buffer_;
    if ((puVar1 != (undefined8 *)0x0) && ((undefined8 *)*puVar1 != puVar1 + 2)) {
      operator_delete((undefined8 *)*puVar1);
    }
    break;
  default:
    goto switchD_00193823_default;
  }
  operator_delete(puVar1);
  return;
}

Assistant:

FlagValue::~FlagValue() {
  if (!owns_value_) {
    return;
  }
  switch (type_) {
    case FV_BOOL: delete reinterpret_cast<bool*>(value_buffer_); break;
    case FV_INT32: delete reinterpret_cast<int32*>(value_buffer_); break;
    case FV_UINT32: delete reinterpret_cast<uint32*>(value_buffer_); break;
    case FV_INT64: delete reinterpret_cast<int64*>(value_buffer_); break;
    case FV_UINT64: delete reinterpret_cast<uint64*>(value_buffer_); break;
    case FV_DOUBLE: delete reinterpret_cast<double*>(value_buffer_); break;
    case FV_STRING: delete reinterpret_cast<string*>(value_buffer_); break;
  }
}